

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_cwksp.h
# Opt level: O2

void * duckdb_zstd::ZSTD_cwksp_reserve_table(ZSTD_cwksp *ws,size_t bytes)

{
  void *pvVar1;
  size_t sVar2;
  void *pvVar3;
  
  if ((0 < (int)ws->phase) ||
     (sVar2 = ZSTD_cwksp_internal_advance_phase(ws,ZSTD_cwksp_alloc_aligned_init_once),
     sVar2 < 0xffffffffffffff89)) {
    pvVar1 = ws->tableEnd;
    pvVar3 = (void *)(bytes + (long)pvVar1);
    if (pvVar3 <= ws->allocStart) {
      ws->tableEnd = pvVar3;
      return pvVar1;
    }
    ws->allocFailed = '\x01';
  }
  return (void *)0x0;
}

Assistant:

MEM_STATIC void* ZSTD_cwksp_reserve_table(ZSTD_cwksp* ws, size_t bytes)
{
    const ZSTD_cwksp_alloc_phase_e phase = ZSTD_cwksp_alloc_aligned_init_once;
    void* alloc;
    void* end;
    void* top;

    /* We can only start allocating tables after we are done reserving space for objects at the
     * start of the workspace */
    if(ws->phase < phase) {
        if (ZSTD_isError(ZSTD_cwksp_internal_advance_phase(ws, phase))) {
            return NULL;
        }
    }
    alloc = ws->tableEnd;
    end = (BYTE *)alloc + bytes;
    top = ws->allocStart;

    DEBUGLOG(5, "cwksp: reserving %p table %zd bytes, %zd bytes remaining",
        alloc, bytes, ZSTD_cwksp_available_space(ws) - bytes);
    assert((bytes & (sizeof(U32)-1)) == 0);
    ZSTD_cwksp_assert_internal_consistency(ws);
    assert(end <= top);
    if (end > top) {
        DEBUGLOG(4, "cwksp: table alloc failed!");
        ws->allocFailed = 1;
        return NULL;
    }
    ws->tableEnd = end;

    assert((bytes & (ZSTD_CWKSP_ALIGNMENT_BYTES-1)) == 0);
    assert(((size_t)alloc & (ZSTD_CWKSP_ALIGNMENT_BYTES-1))== 0);
    return alloc;
}